

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void compact_int16_suite::fail_array64_int16_invalid_length(void)

{
  undefined4 local_4c;
  value local_48 [2];
  undefined1 local_40 [8];
  decoder decoder;
  value_type input [13];
  
  stack0xffffffffffffffeb = 0x3da;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[13]>
            ((decoder *)local_40,(uchar (*) [13])((long)&decoder.current.view._M_str + 3));
  local_48[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_40);
  local_4c = 3;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::error_invalid_length",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x828,"void compact_int16_suite::fail_array64_int16_invalid_length()",local_48,
             &local_4c);
  return;
}

Assistant:

void fail_array64_int16_invalid_length()
{
    const value_type input[] = { token::code::array64_int16, 0x03, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x12, 0x34, 0x56, 0x78 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::error_invalid_length);
}